

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseMinTypMaxExpression
          (Parser *this,bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  bool bVar1;
  MinTypMaxExpressionSyntax *min;
  ExpressionSyntax *typ;
  ExpressionSyntax *max;
  Token colon1;
  Token colon2;
  
  min = (MinTypMaxExpressionSyntax *)parseSubExpression(this,options,0);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Colon);
  if (bVar1) {
    colon1 = ParserBase::consume(&this->super_ParserBase);
    typ = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
    colon2 = ParserBase::expect(&this->super_ParserBase,Colon);
    max = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
    min = slang::syntax::SyntaxFactory::minTypMaxExpression
                    (&this->factory,(ExpressionSyntax *)min,colon1,typ,colon2,max);
  }
  return &min->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseMinTypMaxExpression(bitmask<ExpressionOptions> options) {
    ExpressionSyntax& first = parseSubExpression(options, 0);
    if (!peek(TokenKind::Colon))
        return first;

    auto colon1 = consume();
    auto& typ = parseExpression();
    auto colon2 = expect(TokenKind::Colon);
    auto& max = parseExpression();

    return factory.minTypMaxExpression(first, colon1, typ, colon2, max);
}